

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O0

Ref __thiscall
wasm::Wasm2JSBuilder::processExpression(wasm::Expression*,wasm::Module*,wasm::Function*,bool)::
ExpressionProcessor::visit(wasm::Expression*,wasm::IString_
          (void *this,Expression *curr,IString nextResult)

{
  undefined1 local_40 [8];
  IString old;
  Expression *curr_local;
  ExpressionProcessor *this_local;
  IString nextResult_local;
  Ref ret;
  
  nextResult_local.str._M_len = (size_t)nextResult.str._M_str;
  this_local = (ExpressionProcessor *)nextResult.str._M_len;
  local_40 = *(undefined1 (*) [8])((long)this + 8);
  old.str._M_len = *(size_t *)((long)this + 0x10);
  old.str._M_str = (char *)curr;
  IString::operator=((IString *)((long)this + 8),(IString *)&this_local);
  nextResult_local.str._M_str =
       (char *)Visitor<ExpressionProcessor,_cashew::Ref>::visit
                         ((Visitor<ExpressionProcessor,_cashew::Ref> *)this,
                          (Expression *)old.str._M_str);
  IString::operator=((IString *)((long)this + 8),(IString *)local_40);
  return (Ref)(Value *)nextResult_local.str._M_str;
}

Assistant:

Ref visit(Expression* curr, IString nextResult) {
      IString old = result;
      result = nextResult;
      Ref ret = OverriddenVisitor::visit(curr);
      // keep it consistent for the rest of this frame, which may call visit on
      // multiple children
      result = old;
      return ret;
    }